

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_to_utf16
                  (archive_string *as16,void *_p,size_t length,archive_string_conv *sc,
                  wchar_t bigendian)

{
  archive_string *paVar1;
  uint local_58;
  wchar_t local_54;
  uint c;
  wchar_t ret;
  size_t remaining;
  char *utf16;
  char *s;
  wchar_t bigendian_local;
  archive_string_conv *sc_local;
  size_t length_local;
  void *_p_local;
  archive_string *as16_local;
  
  local_54 = L'\0';
  paVar1 = archive_string_ensure(as16,as16->length + (length + 1) * 2);
  if (paVar1 == (archive_string *)0x0) {
    as16_local._4_4_ = L'\xffffffff';
  }
  else {
    remaining = (size_t)(as16->s + as16->length);
    _c = length;
    utf16 = (char *)_p;
    while (_c != 0) {
      local_58 = (uint)*utf16;
      if (0x7f < local_58) {
        local_58 = 0xfffd;
        local_54 = L'\xffffffff';
      }
      if (bigendian == L'\0') {
        archive_le16enc((void *)remaining,(uint16_t)local_58);
      }
      else {
        archive_be16enc((void *)remaining,(uint16_t)local_58);
      }
      remaining = remaining + 2;
      _c = _c - 1;
      utf16 = utf16 + 1;
    }
    as16->length = remaining - (long)as16->s;
    as16->s[as16->length] = '\0';
    as16->s[as16->length + 1] = '\0';
    as16_local._4_4_ = local_54;
  }
  return as16_local._4_4_;
}

Assistant:

static int
best_effort_strncat_to_utf16(struct archive_string *as16, const void *_p,
    size_t length, struct archive_string_conv *sc, int bigendian)
{
	const char *s = (const char *)_p;
	char *utf16;
	size_t remaining;
	int ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	remaining = length;

	if (archive_string_ensure(as16,
	    as16->length + (length + 1) * 2) == NULL)
		return (-1);

	utf16 = as16->s + as16->length;
	while (remaining--) {
		unsigned c = *s++;
		if (c > 127) {
			/* We cannot handle it. */
			c = UNICODE_R_CHAR;
			ret = -1;
		}
		if (bigendian)
			archive_be16enc(utf16, (uint16_t)c);
		else
			archive_le16enc(utf16, (uint16_t)c);
		utf16 += 2;
	}
	as16->length = utf16 - as16->s;
	as16->s[as16->length] = 0;
	as16->s[as16->length+1] = 0;
	return (ret);
}